

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kprint.c
# Opt level: O1

void prindatum(LispPTR x)

{
  int iVar1;
  DLword *pDVar2;
  LispPTR LVar3;
  long lVar4;
  uint uVar5;
  LispPTR LVar6;
  ulong uVar7;
  char *__format;
  
  pDVar2 = DTDspace;
  lVar4 = (long)Printdepth;
  if (PrintMaxLevel <= Printdepth) {
    if (Printdepth != PrintMaxLevel) {
      return;
    }
    if ((*(ushort *)((ulong)(x >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 5) {
      putchar(0x2a);
      return;
    }
    printf("(-)");
    return;
  }
  LVar6 = x & 0xfffffff;
  uVar5 = *(ushort *)((ulong)(x >> 8 & 0xffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
  switch(uVar5) {
  case 1:
    if ((x & 0xfff0000) == 0xe0000) {
      uVar7 = (ulong)x & 0xffff;
      __format = "%d";
    }
    else {
      uVar7 = (ulong)(x | 0xffff0000);
      __format = "%d";
    }
    break;
  case 2:
    print_fixp(LVar6);
    return;
  case 3:
    print_floatp(LVar6);
    return;
  case 4:
  case 0x15:
    print_atomname(LVar6);
    return;
  case 5:
    Printdepth = Printdepth + 1;
    PrintLen[lVar4 + 1] = 0;
    putchar(0x28);
    do {
      iVar1 = PrintLen[Printdepth];
      PrintLen[Printdepth] = iVar1 + 1;
      if (PrintMaxLen < iVar1) {
LAB_00129d69:
        putchar(0x29);
        Printdepth = Printdepth + -1;
        return;
      }
      LVar3 = car(LVar6);
      prindatum(LVar3);
      pDVar2 = MDStypetbl;
      LVar3 = cdr(LVar6);
      if ((*(ushort *)((ulong)(pDVar2 + (LVar3 >> 9)) ^ 2) & 0x7ff) != 5) {
        LVar6 = cdr(LVar6);
        if (LVar6 != 0) {
          printf(" . ");
          prindatum(LVar6);
        }
        goto LAB_00129d69;
      }
      putchar(0x20);
      LVar6 = cdr(LVar6);
    } while( true );
  default:
    putchar(0x7b);
    uVar5 = *(uint *)((long)pDVar2 + (ulong)uVar5 * 4 + (ulong)(uVar5 << 5)) & 0xfffffff;
    if (uVar5 == 0) {
      printf("unknown");
    }
    else {
      print_atomname(uVar5);
    }
    printf("}0x");
    __format = "%x";
    uVar7 = (ulong)LVar6;
    break;
  case 7:
    print_string(LVar6);
    return;
  case 0xe:
  case 0x10:
    if ((x & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar6);
    }
    if ((*(byte *)((long)Lisp_world + (ulong)LVar6 * 2 + 7) & 0x10) == 0) {
      return;
    }
    print_NEWstring(LVar6);
    return;
  }
  printf(__format,uVar7);
  return;
}

Assistant:

void prindatum(LispPTR x) {
  NEWSTRINGP *newstring;
  struct dtd *dtd_base;
  int typen;
  LispPTR typename;

  if (Printdepth >= PrintMaxLevel) {
    if (Printdepth == PrintMaxLevel) {
      if (GetTypeNumber(x) == TYPE_LISTP) {
        printf("(-)");
      } else
        printf("*");
    }
    return;
  }

  x = x & POINTERMASK;
  switch (typen = GetTypeNumber(x)) {
    case TYPE_LITATOM:
#ifdef BIGATOMS
    case TYPE_NEWATOM:
#endif /* BIGATOMS */
      print_atomname(x);
      break;
    case TYPE_LISTP:
      Printdepth++;
      PrintLen[Printdepth] = 0;
      printf("%c", LEFT_PAREN); /* print "(" */
    lp:
      if (PrintLen[Printdepth]++ > PrintMaxLen) {
        printf("%c", RIGHT_PAREN);
        Printdepth--;
        break;
      }
      prindatum(car(x));
      if (Listp(cdr(x)) == 0) { /* print dotted pair */
        if ((x = cdr(x)) != NIL) {
          printf(" . ");
          prindatum(x);
        }
      } else {
        printf("%c", SPACE);
        x = cdr(x);
        goto lp;
      }
      printf("%c", RIGHT_PAREN); /* print ")" */
      Printdepth--;
      break;

    case TYPE_SMALLP:
      if ((x & SEGMASK) == S_POSITIVE)
        printf("%d", LOLOC(x)); /* print positive smallp */
      else
        printf("%d", (LOLOC(x) | 0xffff0000)); /* print negative smallp */
      break;
    case TYPE_FIXP:
      print_fixp(x); /* print fixp  */
      break;
    case TYPE_FLOATP: print_floatp(x); break;
    case TYPE_STRINGP:
      print_string(x); /* print string */
      break;
    case TYPE_ONED_ARRAY:
    case TYPE_GENERAL_ARRAY:
      newstring = (NEWSTRINGP *)NativeAligned4FromLAddr(x);
      if (newstring->stringp) {
        print_NEWstring(x);
      }
      break;
    default: dtd_base = (struct dtd *)GetDTD(typen); printf("{");
#ifdef BIGVM
      if ((typename = dtd_base->dtd_name) != 0)
#else
      if ((typename = dtd_base->dtd_namelo + (dtd_base->dtd_namehi << 16)) != 0)
#endif
        print_atomname(typename);
      else
        printf("unknown");
      printf("}0x");
      printf("%x", x); /* print lisp address in hex */
  }
}